

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::TagExpression::matches
          (TagExpression *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  TagSet *pTVar1;
  TagSet *pTVar2;
  bool bVar3;
  TagSet *this_00;
  
  pTVar1 = (this->m_tagSets).super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_tagSets).super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    this_00 = pTVar2;
    if (this_00 == pTVar1) break;
    bVar3 = TagSet::matches(this_00,tags);
    pTVar2 = this_00 + 1;
  } while (!bVar3);
  return this_00 != pTVar1;
}

Assistant:

bool matches( std::set<std::string> const& tags ) const {
            std::vector<TagSet>::const_iterator it = m_tagSets.begin();
            std::vector<TagSet>::const_iterator itEnd = m_tagSets.end();
            for(; it != itEnd; ++it )
                if( it->matches( tags ) )
                    return true;
            return false;
        }